

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,
          vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *blinding_keys)

{
  byte bVar1;
  size_type sVar2;
  size_type sVar3;
  string *message;
  ulong uVar4;
  reference this_00;
  const_reference pvVar5;
  uint in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  allocator *paVar6;
  CfdException *this_01;
  UnblindParameter local_150;
  Script local_c0;
  uint local_84;
  undefined1 local_7e;
  undefined1 local_7d;
  uint32_t index;
  allocator local_69;
  string local_68 [32];
  size_type local_48;
  size_type local_40;
  CfdSourceLocation local_38;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *local_20;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *blinding_keys_local;
  ConfidentialTransaction *this_local;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *results;
  
  this_01 = (CfdException *)__return_storage_ptr__;
  local_20 = blinding_keys;
  blinding_keys_local = (vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  sVar2 = ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          ::size(&this->vout_);
  sVar3 = ::std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::size(local_20);
  if (sVar2 != sVar3) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0xb8e;
    local_38.funcname = "UnblindTxOut";
    local_40 = ::std::
               vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
               size(&this->vout_);
    local_48 = ::std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::size
                         (local_20);
    logger::warn<unsigned_long,unsigned_long>
              (&local_38,
               "Unmatch size blinding_keys and txouts.: txout num=[{}], blinding key num=[{}]",
               &local_40,&local_48);
    local_7d = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar6 = &local_69;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"Unmatch size blinding_keys and txouts.",paVar6);
    CfdException::CfdException(this_01,(CfdError)((ulong)paVar6 >> 0x20),message);
    local_7d = 0;
    __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_7e = 0;
  ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::vector
            ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
             0x4e4dbf);
  for (local_84 = 0; uVar4 = (ulong)local_84,
      sVar2 = ::std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              size(&this->vout_), uVar4 < sVar2; local_84 = local_84 + 1) {
    this_00 = ::std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              operator[](&this->vout_,(ulong)local_84);
    AbstractTxOut::GetLockingScript(&local_c0,&this_00->super_AbstractTxOut);
    bVar1 = Script::IsEmpty(&local_c0);
    Script::~Script((Script *)
                    CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe76,
                                            CONCAT24(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70))));
    if ((bVar1 & 1) == 0) {
      pvVar5 = ::std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                         (local_20,(ulong)local_84);
      in_stack_fffffffffffffe76 = Privkey::IsValid(pvVar5);
      if ((bool)in_stack_fffffffffffffe76) {
        in_stack_fffffffffffffe70 = local_84;
        pvVar5 = ::std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::operator[]
                           (local_20,(ulong)local_84);
        UnblindTxOut(&local_150,this,in_stack_fffffffffffffe70,pvVar5);
        ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
        push_back((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                   *)this_01,&local_150);
        UnblindParameter::~UnblindParameter
                  ((UnblindParameter *)
                   CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe76,
                                           CONCAT24(in_stack_fffffffffffffe74,
                                                    in_stack_fffffffffffffe70))));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxOut(
    const std::vector<Privkey> &blinding_keys) {
  // validate input vector size
  if (vout_.size() != blinding_keys.size()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch size blinding_keys and txouts.:"
        " txout num=[{}], blinding key num=[{}]",
        vout_.size(), blinding_keys.size());
    throw CfdException(
        kCfdIllegalArgumentError, "Unmatch size blinding_keys and txouts.");
  }

  std::vector<UnblindParameter> results;
  for (uint32_t index = 0; index < vout_.size(); index++) {
    // skip if vout is txout for fee
    if (vout_[index].GetLockingScript().IsEmpty()) {
      // fall-through
    } else if (!blinding_keys[index].IsValid()) {
      // fall-through
    } else {
      results.push_back(UnblindTxOut(index, blinding_keys[index]));
    }
  }

  return results;
}